

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::Serialization<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  value_type_conflict6 local_28;
  size_t s;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&s,8);
  local_28 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(v,s,&local_28);
  if (s != 0) {
    (*bb->_vptr_BinaryBuffer[4])
              (bb,(v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start,s << 3);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }